

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::compFlux
          (MLCellLinOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  bool bVar1;
  MFIter *mfi_00;
  MFItInfo *this_00;
  FArrayBox *pFVar2;
  reference ppFVar3;
  undefined8 in_RCX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> src;
  Array4<double> dst;
  Box *nbx;
  int idim;
  Elixir elifz;
  Elixir elify;
  Elixir elifx;
  Box bx_2;
  Box bx_1;
  Box bx;
  Box *tbx;
  MFIter mfi;
  Array<FArrayBox_*,_3> pflux;
  Array<FArrayBox,_3> flux;
  MFItInfo mfi_info;
  int ncomp;
  int mglev;
  size_type in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 uVar4;
  int in_stack_fffffffffffff8b4;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff8b8;
  MFIter *in_stack_fffffffffffff8c0;
  MFItInfo *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  MFIter *in_stack_fffffffffffff8e0;
  MFIter *pMVar5;
  MFIter *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff920;
  undefined4 uVar6;
  int local_6b8;
  int local_6b4;
  BATType local_6b0;
  int local_6ac;
  Array4<double> local_668;
  Array4<const_double> local_628;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  undefined1 local_5a4 [168];
  uint local_4fc;
  undefined1 local_4f8 [24];
  uint local_4e0;
  Vector<int,_std::allocator<int>_> local_4dc;
  Vector<int,_std::allocator<int>_> *local_4c0;
  MFIter local_4a8;
  reference local_448;
  reference local_440;
  reference local_438;
  MFItInfo local_358;
  int local_344;
  undefined4 local_340;
  undefined4 local_33c;
  undefined8 local_338;
  undefined4 local_324;
  undefined8 local_318;
  BATType local_310;
  FabArray<amrex::FArrayBox> *local_308;
  int local_2fc;
  int iStack_2f8;
  BATType local_2f4;
  undefined8 local_2f0;
  int local_2e8;
  FabArray<amrex::FArrayBox> *local_2e0;
  uint local_2d4;
  int iStack_2d0;
  int local_2cc;
  int local_2c8;
  BATType local_2c4;
  int local_2c0;
  int local_2bc;
  Array4<const_double> *local_2b8;
  int local_2b0;
  BATType local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_2a0;
  undefined4 local_294;
  BATOp *local_290;
  undefined4 local_284;
  BATOp *local_280;
  undefined4 local_274;
  BATOp *local_270;
  undefined4 local_264;
  FabArray<amrex::FArrayBox> *local_260;
  undefined4 local_254;
  FabArray<amrex::FArrayBox> *local_250;
  undefined4 local_244;
  FabArray<amrex::FArrayBox> *local_240;
  undefined4 local_234;
  Vector<int,_std::allocator<int>_> *local_230;
  undefined4 local_224;
  Vector<int,_std::allocator<int>_> *local_220;
  undefined4 local_214;
  Vector<int,_std::allocator<int>_> *local_210;
  value_type local_208;
  undefined4 local_1fc;
  MFIter *local_1f8;
  undefined4 local_1ec;
  uint *local_1e8;
  undefined4 local_1dc;
  uint *local_1d8;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 *local_1c0;
  undefined4 local_1b4;
  uint *local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined1 *local_1a0;
  undefined4 local_194;
  uint *local_190;
  undefined4 local_184;
  uint *local_180;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined1 *local_168;
  undefined4 local_15c;
  uint *local_158;
  undefined4 local_150;
  undefined4 local_14c;
  undefined1 *local_148;
  undefined4 local_13c;
  undefined1 *local_138;
  undefined4 local_12c;
  undefined1 *local_128;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined1 *local_110;
  undefined4 local_104;
  undefined1 *local_100;
  undefined4 local_f4;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_340 = 0;
  local_33c = in_R8D;
  local_338 = in_RCX;
  local_324 = in_ESI;
  local_344 = (**(code **)(*in_RDI + 0x28))();
  uVar6 = local_324;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               in_stack_fffffffffffff8a8);
  mfi_00 = (MFIter *)
           std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::get
                     ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                      CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  uVar4 = 0;
  (**(code **)(*in_RDI + 0x238))(in_RDI,uVar6,0,local_338);
  MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff8c0);
  this_00 = MFItInfo::EnableTiling(&local_358,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_00,true);
  std::array<amrex::FArrayBox,_3UL>::array
            ((array<amrex::FArrayBox,_3UL> *)in_stack_fffffffffffff8c0);
  local_448 = std::array<amrex::FArrayBox,_3UL>::operator[]
                        ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
                         (size_type)mfi_00);
  local_440 = std::array<amrex::FArrayBox,_3UL>::operator[]
                        ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
                         (size_type)mfi_00);
  local_438 = std::array<amrex::FArrayBox,_3UL>::operator[]
                        ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
                         (size_type)mfi_00);
  MFIter::MFIter(in_stack_fffffffffffff8e0,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 in_stack_fffffffffffff8d0);
  while (bVar1 = MFIter::isValid(&local_4a8), bVar1) {
    MFIter::tilebox(in_stack_fffffffffffff910);
    local_4c0 = &local_4dc;
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    local_210 = local_4c0;
    local_214 = 0;
    local_4f8._0_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_4f8._8_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    local_4f8._16_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_4e0 = *(uint *)&local_4c0[1].super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
    in_stack_fffffffffffff910 = (MFIter *)local_4f8;
    local_1fc = 0;
    local_1e8 = &local_4e0;
    local_1ec = 0;
    local_1dc = 0;
    local_1cc = 0;
    if ((local_4e0 & 1) == 0) {
      local_1c0 = local_4f8 + 0xc;
      local_1c4 = 0;
      local_1c8 = 1;
      local_1b0 = &local_4e0;
      local_1b4 = 0;
      local_1a8 = 0;
      local_4e0 = local_4e0 | 1;
    }
    local_1f8 = in_stack_fffffffffffff910;
    local_1d8 = local_1e8;
    FArrayBox::resize((FArrayBox *)in_stack_fffffffffffff8c0,(Box *)in_stack_fffffffffffff8b8,
                      in_stack_fffffffffffff8b4,(Arena *)mfi_00);
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    local_220 = local_4c0;
    local_224 = 1;
    local_5a4._144_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_5a4._152_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    local_5a4._160_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_4fc = *(uint *)&local_4c0[1].super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
    local_1a0 = local_5a4 + 0x90;
    local_1a4 = 1;
    local_190 = &local_4fc;
    local_194 = 1;
    local_184 = 1;
    local_174 = 1;
    if ((local_4fc & 2) == 0) {
      local_168 = local_5a4 + 0x9c;
      local_16c = 1;
      local_170 = 1;
      local_158 = &local_4fc;
      local_15c = 1;
      local_150 = 1;
      local_4fc = local_4fc | 2;
    }
    local_180 = local_190;
    FArrayBox::resize((FArrayBox *)in_stack_fffffffffffff8c0,(Box *)in_stack_fffffffffffff8b8,
                      in_stack_fffffffffffff8b4,(Arena *)mfi_00);
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    local_230 = local_4c0;
    local_234 = 2;
    local_5a4._116_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_5a4._124_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    local_5a4._132_8_ =
         (local_4c0->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_5a4._140_4_ =
         *(undefined4 *)
          &local_4c0[1].super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_148 = local_5a4 + 0x74;
    local_14c = 2;
    local_138 = local_5a4 + 0x8c;
    local_13c = 2;
    local_12c = 2;
    local_11c = 2;
    if ((local_5a4._140_4_ & 4) == 0) {
      local_110 = local_5a4 + 0x80;
      local_114 = 2;
      local_118 = 1;
      local_100 = local_5a4 + 0x8c;
      local_104 = 2;
      local_f4 = 2;
      local_5a4._140_4_ = local_5a4._140_4_ | 4;
    }
    local_128 = local_138;
    FArrayBox::resize((FArrayBox *)in_stack_fffffffffffff8c0,(Box *)in_stack_fffffffffffff8b8,
                      in_stack_fffffffffffff8b4,(Arena *)mfi_00);
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    std::array<amrex::FArrayBox,_3UL>::operator[]
              ((array<amrex::FArrayBox,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
               (size_type)mfi_00);
    BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    pMVar5 = &local_4a8;
    in_stack_fffffffffffff8dc = local_324;
    pFVar2 = FabArray<amrex::FArrayBox>::operator[]
                       ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
                        mfi_00);
    mfi_00 = (MFIter *)((ulong)mfi_00 & 0xffffffff00000000);
    (**(code **)(*in_RDI + 0x250))
              (in_RDI,in_stack_fffffffffffff8dc,pMVar5,&local_448,pFVar2,local_33c);
    for (local_5a4._40_4_ = 0; (int)local_5a4._40_4_ < 3; local_5a4._40_4_ = local_5a4._40_4_ + 1) {
      in_stack_fffffffffffff8b8 = (FabArray<amrex::FArrayBox> *)local_5a4;
      in_stack_fffffffffffff8c0 = &local_4a8;
      MFIter::nodaltilebox
                ((MFIter *)CONCAT44(uVar6,in_stack_fffffffffffff920),(int)((ulong)in_RDI >> 0x20));
      local_5a4._28_8_ = in_stack_fffffffffffff8b8;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)CONCAT44(in_stack_fffffffffffff8b4,uVar4),
                 (size_type)mfi_00);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff8b8,(MFIter *)CONCAT44(in_stack_fffffffffffff8b4,uVar4));
      ppFVar3 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                          ((array<amrex::FArrayBox_*,_3UL> *)
                           CONCAT44(in_stack_fffffffffffff8b4,uVar4),(size_type)mfi_00);
      local_208 = *ppFVar3;
      local_a8 = (local_208->super_BaseFab<double>).dptr;
      local_b0 = &(local_208->super_BaseFab<double>).domain;
      local_b4 = (local_208->super_BaseFab<double>).nvar;
      local_5c = 0;
      local_88 = (local_b0->smallend).vect[0];
      local_6c = 1;
      iStack_84 = (local_208->super_BaseFab<double>).domain.smallend.vect[1];
      local_d0.x = (local_b0->smallend).vect[0];
      local_d0.y = (local_b0->smallend).vect[1];
      local_7c = 2;
      local_d0.z = (local_208->super_BaseFab<double>).domain.smallend.vect[2];
      local_8 = &(local_208->super_BaseFab<double>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(local_208->super_BaseFab<double>).domain.bigend;
      local_1c = 1;
      iStack_34 = (local_208->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      local_28 = &(local_208->super_BaseFab<double>).domain.bigend;
      local_2c = 2;
      local_f0.z = (local_208->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      Array4<double>::Array4(&local_668,local_a8,&local_c0,&local_e0,local_b4);
      Array4<const_double>::Array4<const_double,_0>(&local_628,&local_668);
      local_308 = (FabArray<amrex::FArrayBox> *)local_5a4._28_8_;
      local_240 = (FabArray<amrex::FArrayBox> *)local_5a4._28_8_;
      local_244 = 0;
      local_2fc = *(int *)local_5a4._28_8_;
      local_250 = (FabArray<amrex::FArrayBox> *)local_5a4._28_8_;
      local_254 = 1;
      iStack_2f8 = *(int *)(local_5a4._28_8_ + 4);
      local_318 = *(undefined8 *)local_5a4._28_8_;
      local_260 = (FabArray<amrex::FArrayBox> *)local_5a4._28_8_;
      local_264 = 2;
      local_310 = (((BoxArray *)(local_5a4._28_8_ + 8))->m_bat).m_bat_type;
      local_2e0 = (FabArray<amrex::FArrayBox> *)local_5a4._28_8_;
      local_270 = (BATOp *)(local_5a4._28_8_ + 0xc);
      local_274 = 0;
      local_2d4 = (local_270->m_indexType).m_typ.itype;
      local_280 = (BATOp *)(local_5a4._28_8_ + 0xc);
      local_284 = 1;
      iStack_2d0 = *(int *)(local_5a4._28_8_ + 0x10);
      local_2f0 = *(undefined8 *)local_270;
      local_290 = (BATOp *)(local_5a4._28_8_ + 0xc);
      local_294 = 2;
      local_2e8 = *(int *)(local_5a4._28_8_ + 0x14);
      for (local_6ac = 0; local_6b0 = local_310, local_6ac < local_344; local_6ac = local_6ac + 1) {
        for (; local_6b4 = iStack_2f8, (int)local_6b0 <= local_2e8;
            local_6b0 = local_6b0 + indexType) {
          for (; local_6b8 = local_2fc, local_6b4 <= iStack_2d0; local_6b4 = local_6b4 + 1) {
            for (; local_6b8 <= (int)local_2d4; local_6b8 = local_6b8 + 1) {
              local_2bc = local_6b8;
              local_2c0 = local_6b4;
              local_2c4 = local_6b0;
              local_2c8 = local_6ac;
              local_2b8 = &local_628;
              local_2a4 = local_6b8;
              local_2a8 = local_6b4;
              local_2ac = local_6b0;
              local_2b0 = local_6ac;
              local_2a0 = &local_5e8;
              *(double *)
               (local_5e8 +
               ((long)(local_6b8 - local_5c8) + (local_6b4 - local_5c4) * local_5e0 +
                (int)(local_6b0 - local_5c0) * local_5d8 + local_6ac * local_5d0) * 8) =
                   local_628.p
                   [(long)(local_6b8 - local_628.begin.x) +
                    (local_6b4 - local_628.begin.y) * local_628.jstride +
                    (int)(local_6b0 - local_628.begin.z) * local_628.kstride +
                    local_6ac * local_628.nstride];
            }
          }
        }
      }
      local_2f4 = local_310;
      local_2cc = local_2e8;
    }
    Gpu::Elixir::~Elixir((Elixir *)CONCAT44(in_stack_fffffffffffff8b4,uVar4));
    Gpu::Elixir::~Elixir((Elixir *)CONCAT44(in_stack_fffffffffffff8b4,uVar4));
    Gpu::Elixir::~Elixir((Elixir *)CONCAT44(in_stack_fffffffffffff8b4,uVar4));
    MFIter::operator++(&local_4a8);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff8b4,uVar4));
  std::array<amrex::FArrayBox,_3UL>::~array
            ((array<amrex::FArrayBox,_3UL> *)in_stack_fffffffffffff8c0);
  return;
}

Assistant:

void
MLCellLinOp::compFlux (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLCellLinOp::compFlux()");

    const int mglev = 0;
    const int ncomp = getNComp();
    applyBC(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution,
            m_bndry_sol[amrlev].get());

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        Array<FArrayBox,AMREX_SPACEDIM> flux;
        Array<FArrayBox*,AMREX_SPACEDIM> pflux {{ AMREX_D_DECL(&flux[0], &flux[1], &flux[2]) }};
        for (MFIter mfi(sol, mfi_info);  mfi.isValid(); ++mfi)
        {
            const Box& tbx = mfi.tilebox();
            AMREX_D_TERM(flux[0].resize(amrex::surroundingNodes(tbx,0),ncomp);,
                         flux[1].resize(amrex::surroundingNodes(tbx,1),ncomp);,
                         flux[2].resize(amrex::surroundingNodes(tbx,2),ncomp););
            AMREX_D_TERM(Elixir elifx = flux[0].elixir();,
                         Elixir elify = flux[1].elixir();,
                         Elixir elifz = flux[2].elixir(););
            FFlux(amrlev, mfi, pflux, sol[mfi], loc);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src =  pflux[idim]->array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, ncomp, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }
        }
    }
}